

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O1

size_t __thiscall SimpleString::count(SimpleString *this,SimpleString *substr)

{
  char *s2;
  char *pcVar1;
  size_t sVar2;
  char *s1;
  
  s1 = this->buffer_;
  if (*s1 == '\0') {
    sVar2 = 0;
  }
  else {
    s2 = substr->buffer_;
    sVar2 = 0;
    do {
      pcVar1 = StrStr(s1,s2);
      if (pcVar1 == (char *)0x0) {
        return sVar2;
      }
      s1 = pcVar1 + 1;
      sVar2 = sVar2 + 1;
    } while (pcVar1[1] != '\0');
  }
  return sVar2;
}

Assistant:

const char* SimpleString::getBuffer() const
{
    return buffer_;
}